

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O2

void __thiscall Progress::done(Progress *this)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = fileno(_stdout);
  iVar1 = isatty(iVar1);
  if (iVar1 != 0) {
    if (this->remove == true) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\r");
      poVar2 = std::operator<<(poVar2,0x20);
      *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)this->width;
      std::operator<<(poVar2,' ');
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  return;
}

Assistant:

void Progress::done ()
{
  if (isatty (fileno (stdout)))
  {
    if (remove)
      std::cout << "\r"
                << std::setfill (' ')
                << std::setw (width)
                << ' ';

    std::cout << std::endl;
  }
}